

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solution.cpp
# Opt level: O2

void __thiscall Solution::createNursesAndTurns(Solution *this)

{
  ShiftType *this_00;
  pointer pNVar1;
  pointer pbVar2;
  int iVar3;
  Scenario *pSVar4;
  vector<Nurse,_std::allocator<Nurse>_> *pvVar5;
  string *psVar6;
  NurseSolution *this_01;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>_>
  *pmVar7;
  ShiftType *this_02;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar8;
  Turn *this_03;
  _Base_ptr p_Var9;
  pointer this_04;
  int day;
  pointer pbVar10;
  Turn *turn;
  Solution *local_e0;
  _Base_ptr local_d8;
  _Base_ptr local_d0;
  vector<Turn_*,_std::allocator<Turn_*>_> shifts;
  string skill;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>
  local_90;
  
  pSVar4 = Scenario::getInstance();
  pvVar5 = Scenario::getNurses(pSVar4);
  pNVar1 = (pvVar5->super__Vector_base<Nurse,_std::allocator<Nurse>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_e0 = this;
  for (this_04 = (pvVar5->super__Vector_base<Nurse,_std::allocator<Nurse>_>)._M_impl.
                 super__Vector_impl_data._M_start; this_04 != pNVar1; this_04 = this_04 + 1) {
    psVar6 = Nurse::getId_abi_cxx11_(this_04);
    this_01 = (NurseSolution *)operator_new(0x20);
    NurseSolution::NurseSolution(this_01,this_04);
    std::__cxx11::string::string((string *)&local_90,(string *)psVar6);
    local_90.second.id._M_dataplus._M_p = (pointer)this_01;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,NurseSolution*>,std::_Select1st<std::pair<std::__cxx11::string_const,NurseSolution*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,NurseSolution*>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,NurseSolution*>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,NurseSolution*>,std::_Select1st<std::pair<std::__cxx11::string_const,NurseSolution*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,NurseSolution*>>>
                *)&this->nurses,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>
                *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
  }
  local_e0 = (Solution *)&local_e0->turns;
  for (day = 0; day != 7; day = day + 1) {
    shifts.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    shifts.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    shifts.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    pSVar4 = Scenario::getInstance();
    pmVar7 = Scenario::getShifts_abi_cxx11_(pSVar4);
    local_d8 = &(pmVar7->_M_t)._M_impl.super__Rb_tree_header._M_header;
    p_Var9 = (pmVar7->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    while (p_Var9 != local_d8) {
      local_d0 = p_Var9;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>
      ::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType,_true>
                (&local_90,
                 (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>
                  *)(p_Var9 + 1));
      this_02 = (ShiftType *)operator_new(0x40);
      this_00 = &local_90.second;
      psVar6 = ShiftType::getId_abi_cxx11_(this_00);
      skill._M_dataplus._M_p._0_4_ = ShiftType::getMinimumNumberOfConsecutiveAssignments(this_00);
      iVar3 = ShiftType::getMaximumNumberOfConsecutiveAssignments(this_00);
      turn = (Turn *)CONCAT44(turn._4_4_,iVar3);
      ShiftType::ShiftType(this_02,psVar6,(int *)&skill,(int *)&turn);
      pvVar8 = ShiftType::getForbiddenSucceedingShiftTypes_abi_cxx11_(&local_90.second);
      ShiftType::setForbidden(this_02,pvVar8);
      pSVar4 = Scenario::getInstance();
      pvVar8 = Scenario::getSkills_abi_cxx11_(pSVar4);
      pbVar2 = (pvVar8->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar10 = (pvVar8->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start; pbVar10 != pbVar2;
          pbVar10 = pbVar10 + 1) {
        std::__cxx11::string::string((string *)&skill,(string *)pbVar10);
        this_03 = (Turn *)operator_new(0x50);
        Turn::Turn(this_03,day,&skill,this_02);
        turn = this_03;
        std::vector<Turn_*,_std::allocator<Turn_*>_>::push_back(&shifts,&turn);
        std::__cxx11::string::~string((string *)&skill);
      }
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>
      ::~pair(&local_90);
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(local_d0);
    }
    std::
    vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
    ::push_back((vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
                 *)local_e0,
                (value_type *)&shifts.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>);
    std::_Vector_base<Turn_*,_std::allocator<Turn_*>_>::~_Vector_base
              (&shifts.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>);
  }
  return;
}

Assistant:

void Solution::createNursesAndTurns() {
    //create list of nurses with solution
    for (const Nurse &sce_nurses : Scenario::getInstance()->getNurses())
        nurses.insert(make_pair(sce_nurses.getId(),new NurseSolution(&sce_nurses)));

    using req_map = unordered_map<string, unordered_map<ShiftType*, vector<DayRequirement*>>>;

    //hardcoded size of week
    for(int j = 0; j < 7; j++) {
        vector<Turn *> shifts;

        for (pair<string,ShiftType> const &shift :  Scenario::getInstance()->getShifts()) {
            ShiftType* shiftType = new ShiftType(shift.second.getId(),shift.second.getMinimumNumberOfConsecutiveAssignments(),shift.second.getMaximumNumberOfConsecutiveAssignments());
            shiftType->setForbidden(shift.second.getForbiddenSucceedingShiftTypes());
            for(string skill : Scenario::getInstance()->getSkills()) {
                Turn *turn = new Turn(j, skill, shiftType);
                shifts.push_back(turn);
            }
        }
        turns.push_back(shifts);
    }
}